

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QSqlDatabase __thiscall
QHash<QString,_QSqlDatabase>::value(QHash<QString,_QSqlDatabase> *this,QString *key)

{
  QSqlDatabase *pQVar1;
  QSqlDatabasePrivate *in_RDI;
  QSqlDatabase *v;
  QSqlDatabase *in_stack_ffffffffffffffc8;
  QSqlDatabasePrivate *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<QString>((QHash<QString,_QSqlDatabase> *)in_RDI,(QString *)in_RDI);
  if (pQVar1 == (QSqlDatabase *)0x0) {
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)in_RDI);
  }
  else {
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)in_RDI,in_stack_ffffffffffffffc8);
  }
  return (QSqlDatabase)pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }